

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMesh.c
# Opt level: O2

void Bmc_MeshTest(Gia_Man_t *p,int X,int Y,int T,int fVerbose)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  abctime aVar13;
  satoko_t *s;
  undefined4 extraout_var;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  abctime aVar17;
  long lVar18;
  long lVar19;
  abctime time;
  abctime time_00;
  int *piVar20;
  int Var;
  char *pcVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  int (*paiVar25) [102];
  long lVar26;
  int iVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  int *local_a8c8;
  int Lit;
  int local_a8bc;
  ulong local_a8b8;
  long local_a8b0;
  int local_a8a4;
  ulong local_a8a0;
  ulong local_a898;
  ulong local_a890;
  ulong local_a888;
  ulong local_a880;
  ulong local_a878;
  ulong local_a870;
  ulong local_a868;
  ulong local_a860;
  int local_a854;
  int local_a850;
  int local_a84c;
  int iGVars [4];
  int iTVars [4];
  int local_a818;
  int pLits [100];
  int pN [102] [2];
  int Me [102] [102];
  
  local_a8bc = fVerbose;
  aVar13 = Abc_Clock();
  s = satoko_create();
  piVar20 = Me[0];
  memset(piVar20,0,0xa290);
  memset(pN,0,0x330);
  iVar8 = p->vCis->nSize;
  iVar12 = p->nRegs;
  iVar4 = Gia_ManAndNum(p);
  local_a8b8 = CONCAT44(extraout_var,iVar4);
  if (((X < 0x65) && (Y < 0x65)) && (T < 0x65)) {
    uVar23 = iVar8 - iVar12;
    uVar5 = iVar4 + uVar23;
    if ((int)uVar5 < 0x65) {
      uVar14 = 0;
      local_a8a0 = 0;
      if (0 < (int)uVar23) {
        local_a8a0 = (ulong)uVar23;
      }
      for (; local_a8a0 != uVar14; uVar14 = uVar14 + 1) {
        pN[uVar14] = (int  [2])0xffffffffffffffff;
      }
      uVar15 = 0;
      uVar14 = (ulong)(uint)p->nObjs;
      if (p->nObjs < 1) {
        uVar14 = uVar15;
      }
      lVar18 = -1;
      while ((uVar14 * 0xc - uVar15 != 0 && (p->pObjs != (Gia_Obj_t *)0x0))) {
        uVar2 = *(undefined8 *)(&p->pObjs->field_0x0 + uVar15);
        uVar6 = (uint)uVar2;
        if ((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) {
          pN[lVar18][0] = (int)lVar18 - (uVar6 & 0x1fffffff);
          pN[lVar18][1] = (int)lVar18 - ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff);
        }
        uVar15 = uVar15 + 0xc;
        lVar18 = lVar18 + 1;
      }
      local_a878 = (ulong)(uint)Y;
      if (local_a8bc != 0) {
        lVar18 = (long)(int)uVar23;
        printf("The graph has %d inputs: ");
        uVar14 = local_a8a0 & 0xffffffff;
        iVar4 = 0;
        while (iVar22 = (int)uVar14, uVar14 = (ulong)(iVar22 - 1), iVar22 != 0) {
          printf("%c ",(ulong)(iVar4 + 0x61));
          iVar4 = iVar4 + 1;
        }
        uVar6 = Gia_ManAndNum(p);
        printf("  and %d nodes: ",(ulong)uVar6);
        uVar6 = (iVar8 - iVar12) + 0x61;
        for (; lVar18 < (int)uVar5; lVar18 = lVar18 + 1) {
          printf("%c=%c%c ",(ulong)uVar6,(ulong)(pN[lVar18][0] + 0x61));
          uVar6 = uVar6 + 1;
        }
        putchar(10);
      }
      uVar15 = 0;
      uVar14 = 0;
      if (0 < X) {
        uVar14 = (ulong)(uint)X;
      }
      iVar4 = (int)local_a878;
      local_a880 = 0;
      if (0 < iVar4) {
        local_a880 = local_a878 & 0xffffffff;
      }
      uVar28 = 0;
      for (; uVar15 != local_a880; uVar15 = uVar15 + 1) {
        for (lVar18 = 0; uVar14 * 0x198 - lVar18 != 0; lVar18 = lVar18 + 0x198) {
          *(int *)((long)piVar20 + lVar18) = (int)uVar28;
          uVar28 = (ulong)((int)uVar28 + uVar5 + T + 0x11);
        }
        piVar20 = piVar20 + 1;
      }
      Me[0x65][100] = T;
      Me[0x65][0x65] = uVar5;
      if (local_a8bc != 0) {
        iVar22 = iVar4 * X;
        printf("SAT variable count is %d (%d time vars + %d graph vars + %d config vars + %d aux vars)\n"
               ,uVar28,(ulong)(uint)(iVar22 * T),(ulong)(uVar5 * iVar22),
               (ulong)(uint)(iVar22 * 0x10));
      }
      local_a888 = (ulong)(X - 1);
      uVar15 = 0;
      local_a8a4 = 0;
      if (0 < T) {
        local_a8a4 = T;
      }
      local_a890 = (ulong)(iVar4 - 1);
      local_a870 = uVar14;
      for (; uVar15 != local_a870; uVar15 = uVar15 + 1) {
        for (uVar28 = 0; uVar28 != local_a880; uVar28 = uVar28 + 1) {
          iVar4 = Me[uVar15][uVar28];
          if ((uVar15 == 0) || (uVar28 == local_a890 || (uVar28 == 0 || uVar15 == local_a888))) {
            iVar22 = 0;
            while (uVar6 = uVar23, local_a8a4 != iVar22) {
              Lit = Abc_Var2Lit(iVar4 + iVar22,(uint)(iVar22 != 0));
              iVar7 = satoko_add_clause(s,&Lit,1);
              iVar22 = iVar22 + 1;
              if (iVar7 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                              ,0xa8,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
              }
            }
            while ((int)uVar6 < (int)uVar5) {
              Lit = Abc_Var2Lit(uVar6 + iVar4 + T,1);
              iVar22 = satoko_add_clause(s,&Lit,1);
              uVar6 = uVar6 + 1;
              if (iVar22 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                              ,0xae,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
              }
            }
          }
          else {
            Lit = Abc_Var2Lit(iVar4,1);
            iVar4 = satoko_add_clause(s,&Lit,1);
            if (iVar4 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                            ,0xb4,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
            }
          }
        }
      }
      local_a8c8 = (int *)0x0;
      local_a860 = 0;
      if (0 < (int)uVar5) {
        local_a860 = (ulong)uVar5;
      }
      local_a854 = (int)local_a8a0 * 0xc + (int)local_a860 * 8;
      lVar16 = (long)(int)local_a890;
      lVar18 = (long)(int)local_a888;
      uVar6 = ((int)local_a8b8 + iVar8 + T) - iVar12;
      local_a8b8 = (ulong)uVar6;
      iVar8 = uVar6 + 4;
      lVar29 = 1;
      local_a8b0 = lVar18;
      while (lVar26 = lVar29, lVar26 < lVar18) {
        lVar19 = 1;
        while (iVar12 = 1, lVar29 = lVar26 + 1, lVar19 < lVar16) {
          local_a898 = (ulong)(uint)Me[lVar26][lVar19];
          uVar6 = Me[lVar26][lVar19] + T;
          local_a868 = (ulong)uVar6;
          iVar22 = uVar6 + uVar5 + 0x10;
          iTVars[0] = Me[lVar26 + -1][lVar19];
          iGVars[0] = Me[lVar26 + -1][lVar19] + T;
          iTVars[1] = Me[lVar26 + -1][lVar19 + 0x65];
          iGVars[1] = Me[lVar26 + -1][lVar19 + 0x65] + T;
          iTVars[2] = Me[lVar26 + 1][lVar19];
          iGVars[2] = Me[lVar26 + 1][lVar19] + T;
          iTVars[3] = Me[lVar26][lVar19 + 1];
          lVar19 = lVar19 + 1;
          iGVars[3] = iTVars[3] + T;
          iVar4 = (int)local_a860;
          uVar15 = local_a860 & 0xffffffff;
          while (iVar7 = (int)uVar15, uVar15 = (ulong)(iVar7 - 1), iVar7 != 0) {
            pLits[0] = Abc_Var2Lit(uVar6,1);
            pLits[1] = Abc_Var2Lit(iVar22,0);
            iVar7 = satoko_add_clause(s,pLits,2);
            uVar6 = uVar6 + 1;
            if (iVar7 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                            ,0xd6,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
            }
          }
          pLits[0] = Abc_Var2Lit(iVar22,1);
          for (lVar29 = 1; lVar29 < T; lVar29 = lVar29 + 1) {
            iVar7 = Abc_Var2Lit((int)local_a898 + (int)lVar29,0);
            pLits[lVar29] = iVar7;
          }
          iVar7 = satoko_add_clause(s,pLits,T);
          if (iVar7 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                          ,0xde,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
          }
          pLits[0] = Abc_Var2Lit(iVar22,1);
          iVar22 = (int)local_a8b8;
          iVar7 = (int)local_a898;
          for (lVar29 = 0; lVar29 != 0x10; lVar29 = lVar29 + 1) {
            iVar9 = Abc_Var2Lit(iVar22 + iVar7 + (int)lVar29,0);
            pLits[lVar29 + 1] = iVar9;
          }
          iVar22 = satoko_add_clause(s,pLits,0x11);
          if (iVar22 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                          ,0xe5,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
          }
          uVar6 = (int)local_a8c8 + iVar4 + 2;
          iVar4 = (int)local_a8b8;
          iVar7 = (int)local_a898;
          iVar22 = iVar8 + iVar7;
          while( true ) {
            local_a8c8 = (int *)(ulong)uVar6;
            if (T <= iVar12) break;
            Var = iVar12 + (int)local_a898;
            iVar24 = iVar12 + -1;
            for (iVar9 = 0; uVar15 = local_a8a0, iVar9 != (int)local_a860; iVar9 = iVar9 + 1) {
              iVar10 = (int)local_a868 + iVar9;
              lVar18 = 0;
              while (lVar18 != 4) {
                pLits[0] = Abc_Var2Lit(Var,1);
                pLits[1] = Abc_Var2Lit(iVar10,1);
                iVar27 = iVar4 + iVar7 + (int)lVar18;
                pLits[2] = Abc_Var2Lit(iVar27,1);
                pLits[3] = Abc_Var2Lit(iTVars[lVar18] + iVar24,0);
                iVar11 = satoko_add_clause(s,pLits,4);
                if (iVar11 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                ,0xf5,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                }
                pLits[0] = Abc_Var2Lit(Var,1);
                pLits[1] = Abc_Var2Lit(iVar10,1);
                pLits[2] = Abc_Var2Lit(iVar27,1);
                pLits[3] = Abc_Var2Lit(iGVars[lVar18] + iVar9,0);
                iVar11 = satoko_add_clause(s,pLits,4);
                lVar18 = lVar18 + 1;
                if (iVar11 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                ,0xfc,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                }
              }
            }
            uVar6 = uVar6 + local_a854;
            for (iVar9 = 0; lVar29 = (long)(int)uVar23, lVar18 = local_a8b0, iVar9 != (int)uVar15;
                iVar9 = iVar9 + 1) {
              iVar10 = (int)local_a868;
              iVar11 = 0;
              while (iVar11 != 0xc) {
                pLits[0] = Abc_Var2Lit(iVar9 + iVar10,1);
                pLits[1] = Abc_Var2Lit(iVar22 + iVar11,1);
                iVar27 = satoko_add_clause(s,pLits,2);
                iVar11 = iVar11 + 1;
                if (iVar27 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                ,0x105,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                }
              }
            }
            for (; lVar29 < (int)uVar5; lVar29 = lVar29 + 1) {
              iVar9 = pN[lVar29][0];
              uVar6 = uVar6 + 0x30;
              iVar10 = (int)local_a868 + (int)lVar29;
              lVar30 = 0;
              local_a850 = iVar9;
              while (lVar30 != 0xc) {
                if ((iVar9 < 0) || (pN[lVar29][1] < 0)) {
                  __assert_fail("pN[g][0] >= 0 && pN[g][1] >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                ,0x10c,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                }
                local_a84c = pN[lVar29][1];
                pLits[0] = Abc_Var2Lit(Var,1);
                pLits[1] = Abc_Var2Lit(iVar10,1);
                iVar27 = iVar22 + (int)lVar30;
                pLits[2] = Abc_Var2Lit(iVar27,1);
                iVar11 = (&DAT_007ee5e0)[lVar30 * 2];
                pLits[3] = Abc_Var2Lit(iTVars[iVar11] + iVar24,0);
                iVar9 = satoko_add_clause(s,pLits,4);
                if (iVar9 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                ,0x113,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                }
                pLits[0] = Abc_Var2Lit(Var,1);
                pLits[1] = Abc_Var2Lit(iVar10,1);
                pLits[2] = Abc_Var2Lit(iVar27,1);
                iVar1 = (&DAT_007ee5e4)[lVar30 * 2];
                pLits[3] = Abc_Var2Lit(iTVars[iVar1] + iVar24,0);
                iVar9 = satoko_add_clause(s,pLits,4);
                if (iVar9 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                ,0x11a,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                }
                pLits[0] = Abc_Var2Lit(Var,1);
                pLits[1] = Abc_Var2Lit(iVar10,1);
                pLits[2] = Abc_Var2Lit(iVar27,1);
                iVar9 = local_a850;
                pLits[3] = Abc_Var2Lit(iGVars[iVar11] + local_a850,0);
                iVar11 = satoko_add_clause(s,pLits,4);
                if (iVar11 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                ,0x122,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                }
                pLits[0] = Abc_Var2Lit(Var,1);
                pLits[1] = Abc_Var2Lit(iVar10,1);
                pLits[2] = Abc_Var2Lit(iVar27,1);
                pLits[3] = Abc_Var2Lit(local_a84c + iGVars[iVar1],0);
                iVar11 = satoko_add_clause(s,pLits,4);
                lVar30 = lVar30 + 1;
                lVar18 = local_a8b0;
                if (iVar11 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                                ,0x129,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
                }
              }
            }
            iVar12 = iVar12 + 1;
          }
        }
      }
      Lit = Abc_Var2Lit(T + Me[1][1] + uVar5 + -1,0);
      piVar20 = &Lit;
      iVar12 = satoko_add_clause(s,piVar20,1);
      if (iVar12 == 0) {
        printf("Problem has no solution. ");
        aVar17 = Abc_Clock();
        Abc_PrintTime((int)aVar17 - (int)aVar13,(char *)piVar20,time);
      }
      else {
        if (local_a8bc != 0) {
          printf("Finished adding %d clauses. Started solving...\n");
          piVar20 = local_a8c8;
        }
        while (iVar12 = satoko_solve(s), iVar12 == 1) {
          paiVar25 = Me;
          uVar23 = 0;
          for (uVar15 = 0; uVar15 != local_a870; uVar15 = uVar15 + 1) {
            for (uVar28 = 0; local_a880 != uVar28; uVar28 = uVar28 + 1) {
              if ((uVar15 == 0) || (local_a890 == uVar28 || (uVar28 == 0 || uVar15 == local_a888)))
              {
                uVar6 = (*paiVar25)[uVar28] + T;
                iVar4 = uVar6 + uVar5;
              }
              else {
                iVar7 = (*paiVar25)[uVar28] + T;
                uVar6 = uVar5 + iVar7;
                iVar4 = Bmc_MeshAddOneHotness(s,(*paiVar25)[uVar28],iVar7);
                iVar22 = Bmc_MeshAddOneHotness(s,iVar7,uVar6);
                uVar23 = iVar22 + iVar4 + uVar23;
                iVar4 = uVar5 + iVar7 + 0x10;
                lVar18 = local_a8b0;
              }
              piVar20 = (int *)(ulong)uVar6;
              iVar4 = Bmc_MeshAddOneHotness(s,uVar6,iVar4);
              uVar23 = iVar4 + uVar23;
            }
            paiVar25 = paiVar25 + 1;
          }
          if ((int)uVar23 < 1) {
            pcVar21 = "Satisfying solution found. ";
            goto LAB_0048996a;
          }
          piVar20 = (int *)(ulong)uVar23;
          printf("Adding %d one-hotness clauses.\n");
        }
        pcVar21 = "Problem has no solution. ";
        if (iVar12 != -1) {
          if (iVar12 != 0) {
            __assert_fail("status == SATOKO_SAT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                          ,0x14f,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
          }
          pcVar21 = "Computation timed out. ";
        }
LAB_0048996a:
        iVar4 = 0;
        printf(pcVar21);
        aVar17 = Abc_Clock();
        Abc_PrintTime((int)aVar17 - (int)aVar13,(char *)piVar20,time_00);
        if (iVar12 == 1) {
          uVar23 = 0;
          for (lVar29 = 1; lVar29 < lVar16; lVar29 = lVar29 + 1) {
            for (lVar26 = 1; lVar26 < lVar18; lVar26 = lVar26 + 1) {
              iVar12 = Me[lVar26][lVar29];
              for (iVar22 = 0; iVar22 != 4; iVar22 = iVar22 + 1) {
                iVar7 = Bmc_MeshVarValue(s,uVar5 + T + iVar12 + iVar22);
                iVar4 = iVar4 + iVar7;
              }
              for (iVar22 = 0; iVar22 != 0xc; iVar22 = iVar22 + 1) {
                iVar7 = Bmc_MeshVarValue(s,iVar22 + iVar12 + iVar8);
                uVar23 = uVar23 + iVar7;
              }
              lVar18 = local_a8b0;
            }
          }
          printf("The %d x %d mesh with latency %d with %d active cells (%d nodes and %d buffers):\n"
                 ,(ulong)(uint)X,local_a878,T,(ulong)(uVar23 + iVar4),(ulong)uVar23,iVar4);
          printf(" Y\\X ");
          uVar15 = 0;
          while( true ) {
            local_a818 = (int)uVar14;
            if (local_a818 == (int)uVar15) break;
            printf("  %-2d ",uVar15);
            uVar15 = (ulong)((int)uVar15 + 1);
          }
          putchar(10);
          for (uVar14 = 0; uVar14 != local_a880; uVar14 = uVar14 + 1) {
            printf(" %-2d  ",uVar14 & 0xffffffff);
            for (uVar15 = 0; uVar15 != local_a870; uVar15 = uVar15 + 1) {
              iVar8 = Me[uVar15][uVar14];
              bVar3 = false;
              uVar28 = 0;
              while (iVar12 = (int)uVar28, iVar12 != local_a8a4) {
                for (iVar4 = 0; (int)local_a860 != iVar4; iVar4 = iVar4 + 1) {
                  iVar22 = Bmc_MeshVarValue(s,iVar8 + iVar12);
                  if ((iVar22 != 0) && (iVar22 = Bmc_MeshVarValue(s,iVar8 + T + iVar4), iVar22 != 0)
                     ) {
                    printf(" %c%-2d ",(ulong)(iVar4 + 0x61),uVar28);
                    bVar3 = true;
                  }
                }
                uVar28 = (ulong)(iVar12 + 1);
              }
              if (!bVar3) {
                pcVar21 = "     ";
                if ((uVar15 == local_a888 || uVar14 == 0) || uVar14 == local_a890) {
                  pcVar21 = "  *  ";
                }
                if (uVar15 == 0) {
                  pcVar21 = "  *  ";
                }
                printf(pcVar21);
              }
            }
            putchar(10);
          }
        }
      }
      satoko_destroy(s);
      return;
    }
  }
  __assert_fail("X <= 100 && Y <= 100 && T <= 100 && G <= 100",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                ,0x75,"void Bmc_MeshTest(Gia_Man_t *, int, int, int, int)");
}

Assistant:

void Bmc_MeshTest( Gia_Man_t * p, int X, int Y, int T, int fVerbose )
{
    abctime clk = Abc_Clock();
    satoko_t * pSat = satoko_create();
    Gia_Obj_t * pObj;
    int Me[102][102] = {{0}};
    int pN[102][2] = {{0}};
    int I = Gia_ManPiNum(p);
    int G = I + Gia_ManAndNum(p);
    int i, x, y, t, g, c, status, RetValue, Lit, iVar, nClauses = 0;

    assert( X <= 100 && Y <= 100 && T <= 100 && G <= 100 );

    // init the graph
    for ( i = 0; i < I; i++ )
        pN[i][0] = pN[i][1] = -1;
    Gia_ManForEachAnd( p, pObj, i )
    {
        pN[i-1][0] = Gia_ObjFaninId0(pObj, i)-1;
        pN[i-1][1] = Gia_ObjFaninId1(pObj, i)-1;
    }
    if ( fVerbose )
    {
        printf( "The graph has %d inputs: ", Gia_ManPiNum(p) );
        for ( i = 0; i < I; i++ )
            printf( "%c ", 'a' + i );
        printf( "  and %d nodes: ", Gia_ManAndNum(p) );
        for ( i = I; i < G; i++ )
            printf( "%c=%c%c ", 'a' + i, 'a' + pN[i][0] , 'a' + pN[i][1] );
        printf( "\n" );
    }

    // init SAT variables (time vars + graph vars + config vars)
    // config variables: 16 = 4 buff vars + 12 node vars
    iVar = 0;
    for ( y = 0; y < Y; y++ )
    for ( x = 0; x < X; x++ )
    {
        //printf( "%3d %3d %3d    %s", iVar, iVar+T, iVar+T+G, x == X-1 ? "\n":"" );
        Me[x][y] = iVar;
        iVar += T + G + NCPARS + 1;
    }
    Me[101][100] = T;
    Me[101][101] = G;
    if ( fVerbose )
        printf( "SAT variable count is %d (%d time vars + %d graph vars + %d config vars + %d aux vars)\n", iVar, X*Y*T, X*Y*G, X*Y*NCPARS, X*Y );

    // add constraints

    // time 0 and primary inputs only on the boundary
    for ( x = 0; x < X; x++ )
    for ( y = 0; y < Y; y++ )
    {
        int iTVar = Bmc_MeshTVar( Me, x, y );
        int iGVar = Bmc_MeshGVar( Me, x, y );

        if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
        {
            // time 0 is required
            for ( t = 0; t < T; t++ )
            {
                Lit = Abc_Var2Lit( iTVar+t, (int)(t > 0) );
                RetValue = satoko_add_clause( pSat, &Lit, 1 );  assert( RetValue );
            }
            // internal nodes are not allowed
            for ( g = I; g < G; g++ )
            {
                Lit = Abc_Var2Lit( iGVar+g, 1 );
                RetValue = satoko_add_clause( pSat, &Lit, 1 );  assert( RetValue );
            }
        }
        else // not a boundary
        {
            Lit = Abc_Var2Lit( iTVar, 1 );  // cannot have time 0
            RetValue = satoko_add_clause( pSat, &Lit, 1 );  assert( RetValue );
        }
    }
    for ( x = 1; x < X-1; x++ )
    for ( y = 1; y < Y-1; y++ )
    {
        int pLits[100], nLits;

        int iTVar = Bmc_MeshTVar( Me, x, y );
        int iGVar = Bmc_MeshGVar( Me, x, y );
        int iCVar = Bmc_MeshCVar( Me, x, y );
        int iUVar = Bmc_MeshUVar( Me, x, y );

        // 0=left  1=up  2=right  3=down
        int iTVars[4]; 
        int iGVars[4];

        iTVars[0] = Bmc_MeshTVar( Me, x-1, y );
        iGVars[0] = Bmc_MeshGVar( Me, x-1, y );

        iTVars[1] = Bmc_MeshTVar( Me, x, y-1 );
        iGVars[1] = Bmc_MeshGVar( Me, x, y-1 );

        iTVars[2] = Bmc_MeshTVar( Me, x+1, y );
        iGVars[2] = Bmc_MeshGVar( Me, x+1, y );

        iTVars[3] = Bmc_MeshTVar( Me, x, y+1 );
        iGVars[3] = Bmc_MeshGVar( Me, x, y+1 );

        // condition when cell is used
        for ( g = 0; g < G; g++ )
        {
            pLits[0] = Abc_Var2Lit( iGVar+g, 1 );
            pLits[1] = Abc_Var2Lit( iUVar, 0 );
            RetValue = satoko_add_clause( pSat, pLits, 2 );  assert( RetValue );
            nClauses++;
        }

        // at least one time is used
        pLits[0] = Abc_Var2Lit( iUVar, 1 );
        for ( t = 1; t < T; t++ )
            pLits[t] = Abc_Var2Lit( iTVar+t, 0 );
        RetValue = satoko_add_clause( pSat, pLits, T );  assert( RetValue );
        nClauses++;

        // at least one config is used
        pLits[0] = Abc_Var2Lit( iUVar, 1 );
        for ( c = 0; c < NCPARS; c++ )
            pLits[c+1] = Abc_Var2Lit( iCVar+c, 0 );
        RetValue = satoko_add_clause( pSat, pLits, NCPARS+1 );  assert( RetValue );
        nClauses++;

        // constraints for each time
        for ( t = 1; t < T; t++ )
        {
            int Conf[12][2] = {{0, 1}, {0, 2}, {0, 3}, {1, 2}, {1, 3}, {2, 3},   {1, 0}, {2, 0}, {3, 0}, {2, 1}, {3, 1}, {3, 2}};
            // buffer
            for ( g = 0; g < G; g++ )
            for ( c = 0; c < 4; c++ )
            {
                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[c]+t-1, 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[c]+g, 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );

                nClauses += 2;
            }
            for ( g = 0; g < I; g++ )
            for ( c = 4; c < NCPARS; c++ )
            {
                pLits[0] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[1] = Abc_Var2Lit( iCVar+c, 1 );
                RetValue = satoko_add_clause( pSat, pLits, 2 );  assert( RetValue );
                nClauses++;
            }
            // node
            for ( g = I; g < G; g++ )
            for ( c = 0; c < 12; c++ )
            {
                assert( pN[g][0] >= 0 && pN[g][1] >= 0 );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[Conf[c][0]]+t-1, 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[Conf[c][1]]+t-1, 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );


                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[Conf[c][0]]+pN[g][0], 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[Conf[c][1]]+pN[g][1], 0 );
                RetValue = satoko_add_clause( pSat, pLits, nLits );  assert( RetValue );

                nClauses += 4;
            }
        }
    }

    // final condition
    {
        int iGVar = Bmc_MeshGVar( Me, 1, 1 ) + G-1;
        Lit = Abc_Var2Lit( iGVar, 0 );
        RetValue = satoko_add_clause( pSat, &Lit, 1 );  
        if ( RetValue == 0 )
        {
            printf( "Problem has no solution. " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            satoko_destroy( pSat );
            return;
        }
    }

    if ( fVerbose )
        printf( "Finished adding %d clauses. Started solving...\n", nClauses );

    while ( 1 )
    {
        int nAddClauses = 0;
        status = satoko_solve( pSat );
        if ( status == SATOKO_UNSAT )
        {
            printf( "Problem has no solution. " );
            break;
        }
        if ( status == SATOKO_UNDEC )
        {
            printf( "Computation timed out. " );
            break;
        }
        assert( status == SATOKO_SAT );
        // check if the solution is valid and add constraints
        for ( x = 0; x < X; x++ )
        for ( y = 0; y < Y; y++ )
        {
            if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
            {
                int iGVar = Bmc_MeshGVar( Me, x, y );
                nAddClauses += Bmc_MeshAddOneHotness( pSat, iGVar, iGVar + G );
            }
            else
            {
                int iTVar = Bmc_MeshTVar( Me, x, y );
                int iGVar = Bmc_MeshGVar( Me, x, y );
                int iCVar = Bmc_MeshCVar( Me, x, y );
                nAddClauses += Bmc_MeshAddOneHotness( pSat, iTVar, iTVar + T );
                nAddClauses += Bmc_MeshAddOneHotness( pSat, iGVar, iGVar + G );
                nAddClauses += Bmc_MeshAddOneHotness( pSat, iCVar, iCVar + NCPARS );
            }
        }
        if ( nAddClauses > 0 )
        {
            printf( "Adding %d one-hotness clauses.\n", nAddClauses );
            continue;
        }
        printf( "Satisfying solution found. " );
/*
        iVar = satoko_varnum(pSat);
        for ( i = 0; i < iVar; i++ )
            if ( Bmc_MeshVarValue(pSat, i) )
                printf( "%d ", i );
        printf( "\n" );
*/
        break;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( status == SATOKO_SAT )
    {
        // count the number of nodes and buffers
        int nBuffs = 0, nNodes = 0;
        for ( y = 1; y < Y-1; y++ )
        for ( x = 1; x < X-1; x++ )
        {
            int iCVar = Bmc_MeshCVar( Me, x, y );
            for ( c = 0; c < 4; c++ )
                if ( Bmc_MeshVarValue(pSat, iCVar+c) )
                {
                    //printf( "Buffer y=%d x=%d  (var = %d; config = %d)\n", y, x, iCVar+c, c );
                    nBuffs++;
                }
            for ( c = 4; c < NCPARS; c++ )
                if ( Bmc_MeshVarValue(pSat, iCVar+c) )
                {
                    //printf( "Node   y=%d x=%d  (var = %d; config = %d)\n", y, x, iCVar+c, c );
                    nNodes++;
                }
        }
        printf( "The %d x %d mesh with latency %d with %d active cells (%d nodes and %d buffers):\n", X, Y, T, nNodes+nBuffs, nNodes, nBuffs );
        // print mesh
        printf( " Y\\X " );
        for ( x = 0; x < X; x++ )
            printf( "  %-2d ", x );
        printf( "\n" );
        for ( y = 0; y < Y; y++ )
        {
            printf( " %-2d  ", y );
            for ( x = 0; x < X; x++ )
            {
                int iTVar  = Bmc_MeshTVar( Me, x, y );
                int iGVar  = Bmc_MeshGVar( Me, x, y );

                int fFound = 0;                ;
                for ( t = 0; t < T; t++ )
                for ( g = 0; g < G; g++ )
                    if ( Bmc_MeshVarValue(pSat, iTVar+t) && Bmc_MeshVarValue(pSat, iGVar+g) )
                    {
                        printf( " %c%-2d ", 'a' + g, t );
                        fFound = 1;
                    }
                if ( fFound )
                    continue;
                if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
                    printf( "  *  " );
                else
                    printf( "     " );
            }
            printf( "\n" );
        }
    }
    satoko_destroy( pSat );
}